

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_intarrayinner_t *
ztast_intarrayinner_append(ztast_t *ast,ztast_intarrayinner_t *inner,int val)

{
  int iVar1;
  uint *__dest;
  uint in_EDX;
  ztast_intarrayinner_t *in_RSI;
  long in_RDI;
  uint *newarr;
  int newarrlen;
  int local_2c;
  ztast_intarrayinner_t *local_18;
  
  local_18 = in_RSI;
  if (in_RSI == (ztast_intarrayinner_t *)0x0) {
    local_18 = (ztast_intarrayinner_t *)
               (**(code **)(in_RDI + 8))(0x10,*(undefined8 *)(in_RDI + 0x18));
    if (local_18 == (ztast_intarrayinner_t *)0x0) {
      return (ztast_intarrayinner_t *)0x0;
    }
    local_18->nused = 0;
    local_18->nallocated = 0;
    local_18->ints = (uint *)0x0;
  }
  if (local_18->nused == local_18->nallocated) {
    if (local_18->nallocated < 8) {
      local_2c = 8;
    }
    else {
      local_2c = local_18->nallocated << 1;
    }
    __dest = (uint *)(**(code **)(in_RDI + 8))((long)local_2c << 2,*(undefined8 *)(in_RDI + 0x18));
    if (__dest == (uint *)0x0) {
      return (ztast_intarrayinner_t *)0x0;
    }
    memcpy(__dest,local_18->ints,(long)local_18->nallocated << 2);
    if (*(long *)(in_RDI + 0x10) != 0) {
      (**(code **)(in_RDI + 0x10))(local_18->ints,*(undefined8 *)(in_RDI + 0x18));
    }
    local_18->nallocated = local_2c;
    local_18->ints = __dest;
  }
  iVar1 = local_18->nused;
  local_18->nused = iVar1 + 1;
  local_18->ints[iVar1] = in_EDX;
  return local_18;
}

Assistant:

ztast_intarrayinner_t *ztast_intarrayinner_append(ztast_t               *ast,
                                                  ztast_intarrayinner_t *inner,
                                                  int                    val)
{
  assert(ast);
  /* inner may be NULL - which means allocate */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_intarrayinner_append\n");
#endif

  if (inner == NULL)
  {
    inner = ZTAST_MALLOC(sizeof(*inner));
    if (inner == NULL)
      return NULL;

    inner->nused      = 0;
    inner->nallocated = 0;
    inner->ints       = NULL;
  }

  if (inner->nused == inner->nallocated)
  {
    int           newarrlen;
    unsigned int *newarr;

    /* This code pattern would use realloc() normally but our simple memory
     * manager doesn't currently feature it. */

    newarrlen = inner->nallocated < 8 ? 8 : inner->nallocated * 2;
    newarr = ZTAST_MALLOC(newarrlen * sizeof(*newarr));
    if (newarr == NULL)
      return NULL;

    memcpy(newarr, inner->ints, inner->nallocated * sizeof(*newarr));
    ZTAST_FREE(inner->ints);

    inner->nallocated = newarrlen;
    inner->ints       = newarr;
  }

  inner->ints[inner->nused++] = val;

  return inner;
}